

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> PVar2;
  initializer_list<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> __l;
  allocator_type local_31;
  vector<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::allocator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>
  local_30;
  _func_bool_uchar_ptr_uchar_ptr_int_int_int_int_int *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_18 = (_func_bool_uchar_ptr_uchar_ptr_int_int_int_int_int *)*in_RSI;
  __l._M_len = 1;
  __l._M_array = &local_18;
  std::
  vector<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::allocator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>
  ::vector(&local_30,__l,&local_31);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<bool(*const*)(unsigned_char*,unsigned_char*,int,int,int,int,int),std::vector<bool(*)(unsigned_char*,unsigned_char*,int,int,int,int,int),std::allocator<bool(*)(unsigned_char*,unsigned_char*,int,int,int,int,int)>>>>
                    ((testing *)this,
                     (__normal_iterator<bool_(*const_*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::vector<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::allocator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
                      )local_30.
                       super__Vector_base<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::allocator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<bool_(*const_*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::vector<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::allocator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
                      )local_30.
                       super__Vector_base<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::allocator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_30.
      super__Vector_base<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::allocator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_func_bool_uchar_ptr_uchar_ptr_int_int_int_int_int **)0x0) {
    operator_delete(local_30.
                    super__Vector_base<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::allocator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }